

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

void __thiscall
NJamSpell::TSpellCorrector::Inserts2(TSpellCorrector *this,wstring *w,TWords *result)

{
  TBloomFilter *this_00;
  bool bVar1;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *puVar2;
  wstring *pwVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  undefined1 *local_c0;
  ulong local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  wstring s;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  string local_58;
  TSpellCorrector *local_38;
  
  if (w->_M_string_length != 0xffffffffffffffff) {
    uVar6 = 0;
    s.field_2._8_8_ = result;
    local_38 = this;
    do {
      puVar2 = TLangModel::GetAlphabet(&local_38->LangModel);
      for (p_Var7 = (puVar2->_M_h)._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
          p_Var7 = p_Var7->_M_nxt) {
        std::__cxx11::wstring::substr((ulong)&local_c0,(ulong)w);
        pwVar3 = (wstring *)
                 std::__cxx11::wstring::_M_replace_aux((ulong)&local_c0,local_b8,0,L'\x01');
        std::__cxx11::wstring::wstring((wstring *)&local_58,pwVar3);
        std::__cxx11::wstring::substr((ulong)&local_78,(ulong)w);
        uVar4 = 3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          uVar4 = local_58.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar4 < local_70 + local_58._M_string_length) {
          uVar5 = 3;
          if (local_78 != local_68) {
            uVar5 = local_68[0];
          }
          if (uVar5 < local_70 + local_58._M_string_length) goto LAB_00127a00;
          pwVar3 = (wstring *)
                   std::__cxx11::wstring::replace
                             ((ulong)&local_78,0,(wchar_t *)0x0,(ulong)local_58._M_dataplus._M_p);
        }
        else {
LAB_00127a00:
          pwVar3 = (wstring *)std::__cxx11::wstring::_M_append((wchar_t *)&local_58,(ulong)local_78)
          ;
        }
        std::__cxx11::wstring::wstring((wstring *)local_a0,pwVar3);
        if (local_78 != local_68) {
          operator_delete(local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0);
        }
        this_00 = (local_38->Deletes1)._M_t.
                  super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                  .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
        WideToUTF8(&local_58,(wstring *)local_a0);
        bVar1 = TBloomFilter::Contains(this_00,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if (bVar1) {
          Inserts(local_38,(wstring *)local_a0,(TWords *)s.field_2._8_8_);
        }
        if (local_a0 != (undefined1  [8])&s._M_string_length) {
          operator_delete((void *)local_a0);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < w->_M_string_length + 1);
  }
  return;
}

Assistant:

void TSpellCorrector::Inserts2(const std::wstring& w, TWords& result) const {
    for (size_t i = 0; i < w.size() + 1; ++i) {
        for (auto&& ch: LangModel.GetAlphabet()) {
            std::wstring s = w.substr(0, i) + ch + w.substr(i);
            if (Deletes1->Contains(WideToUTF8(s))) {
                Inserts(s, result);
            }
        }
    }
}